

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

ll_node * ll_find(ll_node *root,ll_predicate fn)

{
  int iVar1;
  
  if (root != (ll_node *)0x0 && fn != (ll_predicate)0x0) {
    do {
      iVar1 = (*fn)(root->value_ptr);
      if (iVar1 != 0) {
        return root;
      }
      root = root->next;
    } while (root != (ll_node *)0x0);
  }
  return (ll_node *)0x0;
}

Assistant:

struct ll_node *ll_find(struct ll_node *root, ll_predicate fn)
{
	struct ll_node *cur_node = root;
	if (fn == NULL) {
		return NULL;
	}
	while (cur_node != NULL) {
		if (fn(cur_node->value_ptr)) {
			return cur_node;
		}
		cur_node = cur_node->next;
	}
	return NULL;
}